

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

bool units::detail::compare_round_equals_precise(double val1,double val2)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool local_39;
  double c2;
  double c1;
  double v1;
  double val2_local;
  double val1_local;
  
  dVar2 = val1 - val2;
  if (((dVar2 == 0.0) && (!NAN(dVar2))) || (iVar1 = std::fpclassify(dVar2), iVar1 == 3)) {
    val1_local._7_1_ = true;
  }
  else {
    dVar2 = cround_precise(val1);
    dVar3 = cround_precise(val2);
    local_39 = true;
    if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) {
      dVar4 = cround_precise(val2 * 1.0000000000005);
      local_39 = true;
      if ((dVar4 != dVar2) || (NAN(dVar4) || NAN(dVar2))) {
        dVar4 = cround_precise(val2 * 0.9999999999995);
        local_39 = true;
        if ((dVar4 != dVar2) || (NAN(dVar4) || NAN(dVar2))) {
          dVar2 = cround_precise(val1 * 1.0000000000005);
          local_39 = true;
          if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) {
            dVar2 = cround_precise(val1 * 0.9999999999995);
            local_39 = dVar2 == dVar3;
          }
        }
      }
    }
    val1_local._7_1_ = local_39;
  }
  return val1_local._7_1_;
}

Assistant:

inline bool compare_round_equals_precise(double val1, double val2)
    {
        static constexpr double half_precise_precision{5e-13};
        auto v1 = val1 - val2;
        if (v1 == 0.0 || std::fpclassify(v1) == FP_SUBNORMAL) {
            return true;
        }
        auto c1 = cround_precise(val1);
        auto c2 = cround_precise(val2);
        // yes these are magic numbers half the value of specified precision of
        // 1e-12 for precise units and yes I am purposely using the floating
        // point equality here
        return (c1 == c2) ||
            (cround_precise(val2 * (1.0 + half_precise_precision)) == c1) ||
            (cround_precise(val2 * (1.0 - half_precise_precision)) == c1) ||
            (cround_precise(val1 * (1.0 + half_precise_precision)) == c2) ||
            (cround_precise(val1 * (1.0 - half_precise_precision)) == c2);
    }